

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::AncillaryMessage> * __thiscall
kj::ArrayBuilder<kj::AncillaryMessage>::operator=
          (ArrayBuilder<kj::AncillaryMessage> *this,ArrayBuilder<kj::AncillaryMessage> *other)

{
  AncillaryMessage *pAVar1;
  RemoveConst<kj::AncillaryMessage> *pRVar2;
  AncillaryMessage *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (AncillaryMessage *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (AncillaryMessage *)0x0;
    this->pos = (RemoveConst<kj::AncillaryMessage> *)0x0;
    this->endPtr = (AncillaryMessage *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pAVar1,0x18,((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (AncillaryMessage *)0x0;
  other->pos = (RemoveConst<kj::AncillaryMessage> *)0x0;
  other->endPtr = (AncillaryMessage *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }